

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O1

CURLcode add_parallel_transfers
                   (GlobalConfig *global,CURLM *multi,CURLSH *share,_Bool *morep,_Bool *addedp)

{
  bool bVar1;
  _Bool _Var2;
  CURLcode CVar3;
  CURLcode CVar4;
  int iVar5;
  time_t tVar6;
  per_transfer *per;
  _Bool getadded;
  _Bool local_4d;
  CURLcode local_4c;
  undefined8 local_48;
  CURLSH *local_40;
  CURLM *local_38;
  
  *addedp = false;
  *morep = false;
  CVar3 = create_transfer(global,share,addedp);
  if (CVar3 == CURLE_OK) {
    CVar3 = CURLE_OK;
    if (transfers == (per_transfer *)0x0) {
      _Var2 = false;
    }
    else {
      local_48 = 0;
      per = transfers;
      local_40 = share;
      local_38 = multi;
      do {
        if (global->parallel_max <= all_added) {
          local_48 = 1;
          break;
        }
        local_4d = false;
        bVar1 = false;
        CVar4 = local_4c;
        if (per->added == false) {
          if ((per->startat == 0) || (tVar6 = time((time_t *)0x0), per->startat <= tVar6)) {
            CVar4 = pre_transfer(global,per);
            bVar1 = true;
            if (CVar4 == CURLE_OK) {
              curl_easy_setopt(per->curl,0xed,global->parallel_connect ^ 1);
              curl_easy_setopt(per->curl,0x2777,per);
              curl_easy_setopt(per->curl,0x4efb,xferinfo_cb);
              curl_easy_setopt(per->curl,0x2749,per);
              iVar5 = curl_multi_add_handle(local_38,per->curl);
              if (iVar5 == 0) {
                CVar4 = create_transfer(global,local_40,&local_4d);
                if (CVar4 == CURLE_OK) {
                  per->added = true;
                  all_added = all_added + 1;
                  *addedp = true;
                  bVar1 = false;
                  CVar4 = local_4c;
                }
              }
              else {
                local_4c = CURLE_OUT_OF_MEMORY;
                CVar4 = local_4c;
              }
            }
          }
          else {
            local_48 = CONCAT71((int7)((ulong)tVar6 >> 8),1);
            CVar4 = local_4c;
          }
        }
        local_4c = CVar4;
        if (bVar1) {
          return local_4c;
        }
        per = per->next;
      } while (per != (per_transfer *)0x0);
      _Var2 = (_Bool)((byte)local_48 & 1);
    }
    *morep = _Var2;
  }
  return CVar3;
}

Assistant:

static CURLcode add_parallel_transfers(struct GlobalConfig *global,
                                       CURLM *multi,
                                       CURLSH *share,
                                       bool *morep,
                                       bool *addedp)
{
  struct per_transfer *per;
  CURLcode result = CURLE_OK;
  CURLMcode mcode;
  bool sleeping = FALSE;
  *addedp = FALSE;
  *morep = FALSE;
  result = create_transfer(global, share, addedp);
  if(result)
    return result;
  for(per = transfers; per && (all_added < global->parallel_max);
      per = per->next) {
    bool getadded = FALSE;
    if(per->added)
      /* already added */
      continue;
    if(per->startat && (time(NULL) < per->startat)) {
      /* this is still delaying */
      sleeping = TRUE;
      continue;
    }

    result = pre_transfer(global, per);
    if(result)
      return result;

    /* parallel connect means that we don't set PIPEWAIT since pipewait
       will make libcurl prefer multiplexing */
    (void)curl_easy_setopt(per->curl, CURLOPT_PIPEWAIT,
                           global->parallel_connect ? 0L : 1L);
    (void)curl_easy_setopt(per->curl, CURLOPT_PRIVATE, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFOFUNCTION, xferinfo_cb);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFODATA, per);

    mcode = curl_multi_add_handle(multi, per->curl);
    if(mcode)
      return CURLE_OUT_OF_MEMORY;

    result = create_transfer(global, share, &getadded);
    if(result)
      return result;
    per->added = TRUE;
    all_added++;
    *addedp = TRUE;
  }
  *morep = (per || sleeping) ? TRUE : FALSE;
  return CURLE_OK;
}